

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O0

ktx_error_code_e ktxMem_expand(ktxMem *pMem,ktx_size_t newsize)

{
  void *pvVar1;
  ulong in_RSI;
  long in_RDI;
  bool bVar2;
  ktx_size_t alloc_size;
  ktx_size_t new_alloc_size;
  ulong local_30;
  ulong local_20;
  ktx_error_code_e local_4;
  
  if ((in_RDI != 0) && (in_RSI != 0)) {
    if (*(long *)(in_RDI + 0x10) == 0) {
      local_30 = 0x100;
    }
    else {
      local_30 = *(ulong *)(in_RDI + 0x10);
    }
    local_20 = local_30;
    while (local_20 < in_RSI) {
      bVar2 = local_20 << 1 < local_20;
      local_20 = local_20 << 1;
      if (bVar2) {
        local_20 = 0xffffffffffffffff;
      }
    }
    if (local_20 == *(ulong *)(in_RDI + 0x10)) {
      local_4 = KTX_SUCCESS;
    }
    else {
      if (*(long *)(in_RDI + 8) == 0) {
        pvVar1 = malloc(local_20);
        *(void **)(in_RDI + 8) = pvVar1;
      }
      else {
        pvVar1 = realloc(*(void **)(in_RDI + 8),local_20);
        *(void **)(in_RDI + 8) = pvVar1;
      }
      if (*(long *)(in_RDI + 8) == 0) {
        *(undefined8 *)(in_RDI + 0x10) = 0;
        *(undefined8 *)(in_RDI + 0x18) = 0;
        local_4 = KTX_OUT_OF_MEMORY;
      }
      else {
        *(ulong *)(in_RDI + 0x10) = local_20;
        local_4 = KTX_SUCCESS;
      }
    }
    return local_4;
  }
  __assert_fail("pMem != NULL && newsize != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/memstream.c"
                ,0xbf,"ktx_error_code_e ktxMem_expand(ktxMem *, const ktx_size_t)");
}

Assistant:

static KTX_error_code
ktxMem_expand(ktxMem *pMem, const ktx_size_t newsize)
{
    ktx_size_t new_alloc_size;

    assert(pMem != NULL && newsize != 0);

    new_alloc_size = pMem->alloc_size == 0 ?
                     KTX_MEM_DEFAULT_ALLOCATED_SIZE : pMem->alloc_size;
    while (new_alloc_size < newsize) {
        ktx_size_t alloc_size = new_alloc_size;
        new_alloc_size <<= 1;
        if (new_alloc_size < alloc_size) {
            /* Overflow. Set to maximum size. newsize can't be larger. */
            new_alloc_size = (ktx_size_t)-1L;
        }
    }

    if (new_alloc_size == pMem->alloc_size)
        return KTX_SUCCESS;

    if (!pMem->bytes)
        pMem->bytes = (ktx_uint8_t*)malloc(new_alloc_size);
    else
        pMem->bytes = (ktx_uint8_t*)realloc(pMem->bytes, new_alloc_size);

    if (!pMem->bytes)
    {
        pMem->alloc_size = 0;
        pMem->used_size = 0;
        return KTX_OUT_OF_MEMORY;
    }

    pMem->alloc_size = new_alloc_size;
    return KTX_SUCCESS;
}